

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

bool __thiscall QPDF::allowPrintLowRes(QPDF *this)

{
  bool bVar1;
  bool local_19;
  int local_18;
  int iStack_14;
  bool status;
  int P;
  int R;
  QPDF *this_local;
  
  iStack_14 = 0;
  local_18 = 0;
  local_19 = true;
  _P = this;
  bVar1 = isEncrypted(this,&stack0xffffffffffffffec,&local_18);
  if (bVar1) {
    local_19 = is_bit_set(local_18,3);
  }
  return local_19;
}

Assistant:

bool
QPDF::allowPrintLowRes()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        status = is_bit_set(P, 3);
    }
    return status;
}